

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.cc
# Opt level: O3

bool __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this,
          vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  pointer pdVar1;
  pointer pdVar2;
  char cVar3;
  int iVar4;
  pointer ppMVar5;
  size_type __new_size;
  pointer pdVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  pointer pdVar8;
  pointer ppMVar9;
  
  if (this->is_valid_ == true) {
    cVar3 = '\0';
    if ((buffer != (Buffer *)0x0) && (output != (vector<double,_std::allocator<double>_> *)0x0)) {
      pdVar8 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      cVar3 = '\0';
      if ((long)pdVar6 - (long)pdVar8 >> 3 == (long)this->num_input_order_ + 1) {
        ppMVar9 = (this->modules_).
                  super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppMVar9 ==
            (this->modules_).
            super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __new_size = (long)this->num_output_order_ + 1;
          if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
            pdVar8 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          cVar3 = '\x01';
          if ((long)pdVar6 - (long)pdVar8 != 0) {
            memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,pdVar8,(long)pdVar6 - (long)pdVar8);
          }
        }
        else {
          do {
            ppMVar5 = ppMVar9;
            if (ppMVar9 !=
                (this->modules_).
                super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              pdVar8 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              pdVar6 = (buffer->temporary_mel_generalized_cepstrum_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar2 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start =
                   (buffer->temporary_mel_generalized_cepstrum_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = pdVar6;
              (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (buffer->temporary_mel_generalized_cepstrum_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              (buffer->temporary_mel_generalized_cepstrum_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = pdVar1;
              (buffer->temporary_mel_generalized_cepstrum_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = pdVar2;
              (buffer->temporary_mel_generalized_cepstrum_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = pdVar8;
              ppMVar5 = (this->modules_).
                        super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            pvVar7 = &buffer->temporary_mel_generalized_cepstrum_;
            if (ppMVar9 == ppMVar5) {
              pvVar7 = input;
            }
            iVar4 = (*(*ppMVar9)->_vptr_ModuleInterface[3])
                              (*ppMVar9,pvVar7,output,&buffer->frequency_transform_buffer_);
            cVar3 = (char)iVar4;
          } while ((cVar3 != '\0') &&
                  (ppMVar9 = ppMVar9 + 1,
                  ppMVar9 !=
                  (this->modules_).
                  super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish));
        }
      }
    }
  }
  else {
    cVar3 = '\0';
  }
  return (bool)cVar3;
}

Assistant:

bool MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run(
    const std::vector<double>& input, std::vector<double>* output,
    MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer* buffer) const {
  if (!is_valid_ ||
      input.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == output || NULL == buffer) {
    return false;
  }

  if (modules_.empty()) {
    if (output->size() != static_cast<std::size_t>(num_output_order_ + 1)) {
      output->resize(num_output_order_ + 1);
    }
    std::copy(input.begin(), input.end(), output->begin());
    return true;
  }

  for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                       ModuleInterface*>::const_iterator itr(modules_.begin());
       itr != modules_.end(); ++itr) {
    if (itr != modules_.begin()) {
      output->swap(buffer->temporary_mel_generalized_cepstrum_);
    }
    if (!(*itr)->Run((itr == modules_.begin())
                         ? input
                         : buffer->temporary_mel_generalized_cepstrum_,
                     output, &(buffer->frequency_transform_buffer_))) {
      return false;
    }
  }

  return true;
}